

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

GenericValue * __thiscall cereal::JSONInputArchive::Iterator::value(Iterator *this)

{
  ulong uVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar2;
  Exception *this_00;
  
  uVar1 = this->itsIndex;
  if (this->itsSize <= uVar1) {
    this_00 = (Exception *)__cxa_allocate_exception(0x10);
    Exception::Exception(this_00,"No more objects in input");
LAB_00145c96:
    __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->itsType == Member) {
    pGVar2 = &(this->itsMemberItBegin).ptr_[uVar1].value;
  }
  else {
    if (this->itsType != Value) {
      this_00 = (Exception *)__cxa_allocate_exception(0x10);
      Exception::Exception
                (this_00,
                 "JSONInputArchive internal error: null or empty iterator to object or array!");
      goto LAB_00145c96;
    }
    pGVar2 = this->itsValueItBegin + uVar1;
  }
  return pGVar2;
}

Assistant:

GenericValue const & value()
          {
            if( itsIndex >= itsSize )
              throw cereal::Exception("No more objects in input");

            switch(itsType)
            {
              case Value : return itsValueItBegin[itsIndex];
              case Member: return itsMemberItBegin[itsIndex].value;
              default: throw cereal::Exception("JSONInputArchive internal error: null or empty iterator to object or array!");
            }
          }